

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestRunScriptCommand.h
# Opt level: O2

void __thiscall cmCTestRunScriptCommand::~cmCTestRunScriptCommand(cmCTestRunScriptCommand *this)

{
  cmCommand::~cmCommand((cmCommand *)this);
  operator_delete(this,0x40);
  return;
}

Assistant:

cmCTestRunScriptCommand() {}